

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsimd_generic_trigo.hpp
# Opt level: O2

batch<float,_xsimd::avx> *
xsimd::kernel::asin<xsimd::avx>
          (batch<float,_xsimd::avx> *__return_storage_ptr__,batch<float,_xsimd::avx> *self,
          requires_arch<generic> param_2)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  batch<float,_xsimd::avx> *pbVar3;
  float fVar4;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar5 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  float local_c0;
  float fStack_bc;
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  batch<float,_xsimd::avx> local_60 [2];
  
  auVar14 = *(undefined1 (*) [32])
             (__return_storage_ptr__->super_simd_register<float,_xsimd::avx>).data;
  auVar13._8_4_ = 0x7fffffff;
  auVar13._0_8_ = 0x7fffffff7fffffff;
  auVar13._12_4_ = 0x7fffffff;
  auVar13._16_4_ = 0x7fffffff;
  auVar13._20_4_ = 0x7fffffff;
  auVar13._24_4_ = 0x7fffffff;
  auVar13._28_4_ = 0x7fffffff;
  auVar5 = vandps_avx(auVar14,auVar13);
  auVar15._8_4_ = 0x3f000000;
  auVar15._0_8_ = 0x3f0000003f000000;
  auVar15._12_4_ = 0x3f000000;
  auVar15._16_4_ = 0x3f000000;
  auVar15._20_4_ = 0x3f000000;
  auVar15._24_4_ = 0x3f000000;
  auVar15._28_4_ = 0x3f000000;
  auVar17._8_4_ = 0x3f800000;
  auVar17._0_8_ = 0x3f8000003f800000;
  auVar17._12_4_ = 0x3f800000;
  auVar17._16_4_ = 0x3f800000;
  auVar17._20_4_ = 0x3f800000;
  auVar17._24_4_ = 0x3f800000;
  auVar17._28_4_ = 0x3f800000;
  auVar13 = vcmpps_avx(auVar15,auVar5,1);
  auVar15 = vsubps_avx(auVar17,auVar5);
  auVar1._4_4_ = auVar15._4_4_ * 0.5;
  auVar1._0_4_ = auVar15._0_4_ * 0.5;
  auVar1._8_4_ = auVar15._8_4_ * 0.5;
  auVar1._12_4_ = auVar15._12_4_ * 0.5;
  auVar1._16_4_ = auVar15._16_4_ * 0.5;
  auVar1._20_4_ = auVar15._20_4_ * 0.5;
  auVar1._24_4_ = auVar15._24_4_ * 0.5;
  auVar1._28_4_ = 0x3f000000;
  auVar2._4_4_ = auVar5._4_4_ * auVar5._4_4_;
  auVar2._0_4_ = auVar5._0_4_ * auVar5._0_4_;
  auVar2._8_4_ = auVar5._8_4_ * auVar5._8_4_;
  auVar2._12_4_ = auVar5._12_4_ * auVar5._12_4_;
  auVar2._16_4_ = auVar5._16_4_ * auVar5._16_4_;
  auVar2._20_4_ = auVar5._20_4_ * auVar5._20_4_;
  auVar2._24_4_ = auVar5._24_4_ * auVar5._24_4_;
  auVar2._28_4_ = auVar15._28_4_;
  local_60[0].super_simd_register<float,_xsimd::avx>.data =
       (simd_register<float,_xsimd::avx>)vblendvps_avx(auVar2,auVar1,auVar13);
  auVar18._8_4_ = 0x80000000;
  auVar18._0_8_ = 0x8000000080000000;
  auVar18._12_4_ = 0x80000000;
  auVar18._16_4_ = 0x80000000;
  auVar18._20_4_ = 0x80000000;
  auVar18._24_4_ = 0x80000000;
  auVar18._28_4_ = 0x80000000;
  vandps_avx(auVar14,auVar18);
  auVar14 = vsqrtps_avx((undefined1  [32])local_60[0].super_simd_register<float,_xsimd::avx>.data);
  auVar14 = vblendvps_avx(auVar5,auVar14,auVar13);
  fVar6 = 0.0;
  fVar7 = 0.0;
  fVar8 = 0.0;
  fVar9 = 0.0;
  fVar10 = 0.0;
  fVar11 = 0.0;
  fVar12 = 0.0;
  fVar4 = auVar14._28_4_;
  pbVar3 = detail::
           horner<xsimd::batch<float,xsimd::avx>,1042983652ul,1033470198ul,1027227335ul,1019615203ul,1026339666ul>
                     (local_60);
  local_c0 = auVar14._0_4_;
  fStack_bc = auVar14._4_4_;
  fStack_b8 = auVar14._8_4_;
  fStack_b4 = auVar14._12_4_;
  fStack_b0 = auVar14._16_4_;
  fStack_ac = auVar14._20_4_;
  fStack_a8 = auVar14._24_4_;
  auVar5._0_4_ = local_c0 +
                 fVar4 * local_c0 * local_60[0].super_simd_register<float,_xsimd::avx>.data[0];
  auVar5._4_4_ = fStack_bc +
                 fVar6 * fStack_bc * local_60[0].super_simd_register<float,_xsimd::avx>.data[1];
  auVar5._8_4_ = fStack_b8 +
                 fVar7 * fStack_b8 * local_60[0].super_simd_register<float,_xsimd::avx>.data[2];
  auVar5._12_4_ =
       fStack_b4 + fVar8 * fStack_b4 * local_60[0].super_simd_register<float,_xsimd::avx>.data[3];
  auVar5._16_4_ =
       fStack_b0 + fVar9 * fStack_b0 * local_60[0].super_simd_register<float,_xsimd::avx>.data[4];
  auVar5._20_4_ =
       fStack_ac + fVar10 * fStack_ac * local_60[0].super_simd_register<float,_xsimd::avx>.data[5];
  auVar5._24_4_ =
       fStack_a8 + fVar11 * fStack_a8 * local_60[0].super_simd_register<float,_xsimd::avx>.data[6];
  auVar5._28_4_ = auVar14._28_4_ + fVar12;
  auVar14._0_4_ = auVar5._0_4_ + auVar5._0_4_;
  auVar14._4_4_ = auVar5._4_4_ + auVar5._4_4_;
  auVar14._8_4_ = auVar5._8_4_ + auVar5._8_4_;
  auVar14._12_4_ = auVar5._12_4_ + auVar5._12_4_;
  auVar14._16_4_ = auVar5._16_4_ + auVar5._16_4_;
  auVar14._20_4_ = auVar5._20_4_ + auVar5._20_4_;
  auVar14._24_4_ = auVar5._24_4_ + auVar5._24_4_;
  auVar14._28_4_ = auVar5._28_4_ + auVar5._28_4_;
  auVar16._8_4_ = 0x3fc90fdb;
  auVar16._0_8_ = 0x3fc90fdb3fc90fdb;
  auVar16._12_4_ = 0x3fc90fdb;
  auVar16._16_4_ = 0x3fc90fdb;
  auVar16._20_4_ = 0x3fc90fdb;
  auVar16._24_4_ = 0x3fc90fdb;
  auVar16._28_4_ = 0x3fc90fdb;
  auVar14 = vsubps_avx(auVar16,auVar14);
  vblendvps_avx(auVar5,auVar14,auVar13);
  return pbVar3;
}

Assistant:

inline batch<float, A> asin(batch<float, A> const& self, requires_arch<generic>) noexcept
        {
            using batch_type = batch<float, A>;
            batch_type x = abs(self);
            batch_type sign = bitofsign(self);
            auto x_larger_05 = x > batch_type(0.5);
            batch_type z = select(x_larger_05, batch_type(0.5) * (batch_type(1.) - x), x * x);
            x = select(x_larger_05, sqrt(z), x);
            batch_type z1 = detail::horner<batch_type,
                                           0x3e2aaae4,
                                           0x3d9980f6,
                                           0x3d3a3ec7,
                                           0x3cc617e3,
                                           0x3d2cb352>(z);
            z1 = fma(z1, z * x, x);
            z = select(x_larger_05, constants::pio2<batch_type>() - (z1 + z1), z1);
            return z ^ sign;
        }